

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrappeTorsionType.hpp
# Opt level: O2

void __thiscall
OpenMD::TrappeTorsionType::TrappeTorsionType
          (TrappeTorsionType *this,RealType c0,RealType c1,RealType c2,RealType c3,bool trans180)

{
  _Rb_tree_header *p_Var1;
  undefined7 in_register_00000031;
  RealType coefficient;
  RealType coefficient_00;
  
  p_Var1 = &(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_PolynomialTorsionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_PolynomialTorsionType).super_TorsionType._vptr_TorsionType =
       (_func_int **)&PTR__PolynomialTorsionType_002c5ad0;
  this->c0_ = c0;
  this->c1_ = c1;
  this->c2_ = c2;
  this->c3_ = c3;
  coefficient_00 = c3 * 4.0;
  if ((int)CONCAT71(in_register_00000031,trans180) == 0) {
    coefficient_00 = -coefficient_00;
  }
  PolynomialTorsionType::setCoefficient(&this->super_PolynomialTorsionType,0,c2 + c2 + c0 + c1 + c3)
  ;
  coefficient = c3 * -3.0 + c1;
  if (!trans180) {
    coefficient = -coefficient;
  }
  PolynomialTorsionType::setCoefficient(&this->super_PolynomialTorsionType,1,coefficient);
  PolynomialTorsionType::setCoefficient(&this->super_PolynomialTorsionType,2,c2 * -2.0);
  PolynomialTorsionType::setCoefficient(&this->super_PolynomialTorsionType,3,coefficient_00);
  return;
}

Assistant:

TrappeTorsionType(RealType c0, RealType c1, RealType c2, RealType c3,
                      bool trans180) :
        PolynomialTorsionType(),
        c0_(c0), c1_(c1), c2_(c2), c3_(c3) {
      // convert Trappe Torsion Type to Polynomial Torsion type

      RealType b0 = c0 + c1 + 2.0 * c2 + c3;
      RealType b1 = c1 - 3.0 * c3;
      RealType b2 = -2.0 * c2;
      RealType b3 = 4.0 * c3;

      if (!trans180) {
        b1 = -b1;
        b3 = -b3;
      }

      setCoefficient(0, b0);
      setCoefficient(1, b1);
      setCoefficient(2, b2);
      setCoefficient(3, b3);
    }